

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall CircularArrayTest_at_Test::TestBody(CircularArrayTest_at_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  TestObject local_44;
  undefined1 local_38 [8];
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  CircularArrayTest_at_Test *this_local;
  
  ca.front_ = (size_type)this;
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38);
  anon_unknown.dwarf_f03f::TestObject::TestObject(&local_44,1,0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38,&local_44);
  anon_unknown.dwarf_f03f::TestObject::~TestObject(&local_44);
  anon_unknown.dwarf_f03f::TestObject::TestObject((TestObject *)&gtest_ar.message_,2,0);
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38,
             (value_type *)&gtest_ar.message_);
  anon_unknown.dwarf_f03f::TestObject::~TestObject((TestObject *)&gtest_ar.message_);
  local_64 = 1;
  pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::at
                     ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38,0);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_60,"1","ca.at(0).data",&local_64,&pvVar2->data);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_94 = 2;
    pvVar2 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::at
                       ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38,1);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_90,"2","ca.at(1).data",&local_94,&pvVar2->data);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-circular-array.cc"
                 ,0x79,pcVar3);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      gtest_ar_1.message_.ptr_._4_4_ = 0;
    }
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)local_38);
  return;
}

Assistant:

TEST_F(CircularArrayTest, at) {
  CircularArray<TestObject, 2> ca;
  ca.push_back(TestObject(1));
  ca.push_back(TestObject(2));

  ASSERT_EQ(1, ca.at(0).data);
  ASSERT_EQ(2, ca.at(1).data);
}